

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall t_cpp_generator::generate_service_helpers(t_cpp_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar3;
  t_struct *tstruct;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar4;
  undefined4 extraout_var_01;
  ofstream_with_content_based_conditional_update *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [8];
  string name_orig;
  t_struct *ts;
  t_function **local_48;
  ofstream_with_content_based_conditional_update *local_40;
  ostream *out;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                     *)&out);
  if ((this->gen_templates_ & 1U) == 0) {
    local_158 = &this->f_service_;
  }
  else {
    local_158 = &this->f_service_tcc_;
  }
  local_40 = local_158;
  local_48 = (t_function **)
             std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                       ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  out = (ostream *)local_48;
  while( true ) {
    ts = (t_struct *)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&out,(__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                                *)&ts);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)&out);
    tstruct = t_function::get_arglist(*pptVar3);
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string(local_88,(string *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2),"_");
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)&out);
    psVar4 = t_function::get_name_abi_cxx11_(*pptVar3);
    std::operator+(&local_c8,&local_e8,psVar4);
    std::operator+(&local_a8,&local_c8,"_args");
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    generate_struct_declaration
              (this,(ostream *)&this->f_header_,tstruct,false,false,true,true,false,false);
    generate_struct_definition
              (this,(ostream *)local_40,(ostream *)&this->f_service_,tstruct,false,false);
    generate_struct_reader(this,(ostream *)local_40,tstruct,false);
    generate_struct_writer(this,(ostream *)local_40,tstruct,false);
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_01,iVar2),"_");
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)&out);
    psVar4 = t_function::get_name_abi_cxx11_(*pptVar3);
    std::operator+(&local_128,&local_148,psVar4);
    std::operator+(&local_108,&local_128,"_pargs");
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    generate_struct_declaration
              (this,(ostream *)&this->f_header_,tstruct,false,true,false,true,false,false);
    generate_struct_definition
              (this,(ostream *)local_40,(ostream *)&this->f_service_,tstruct,false,false);
    generate_struct_writer(this,(ostream *)local_40,tstruct,true);
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,local_88);
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                           *)&out);
    generate_function_helpers(this,tservice,*pptVar3);
    std::__cxx11::string::~string(local_88);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++((__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                *)&out);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_cpp_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  std::ostream& out = (gen_templates_ ? f_service_tcc_ : f_service_);

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name_orig = ts->get_name();

    // TODO(dreiss): Why is this stuff not in generate_function_helpers?
    ts->set_name(tservice->get_name() + "_" + (*f_iter)->get_name() + "_args");
    generate_struct_declaration(f_header_, ts, false);
    generate_struct_definition(out, f_service_, ts, false);
    generate_struct_reader(out, ts);
    generate_struct_writer(out, ts);
    ts->set_name(tservice->get_name() + "_" + (*f_iter)->get_name() + "_pargs");
    generate_struct_declaration(f_header_, ts, false, true, false, true);
    generate_struct_definition(out, f_service_, ts, false);
    generate_struct_writer(out, ts, true);
    ts->set_name(name_orig);

    generate_function_helpers(tservice, *f_iter);
  }
}